

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlstring.c
# Opt level: O1

int xmlUTF8Charcmp(xmlChar *utf1,xmlChar *utf2)

{
  byte *pbVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  
  if (utf1 == (xmlChar *)0x0) {
    return -(uint)(utf2 != (xmlChar *)0x0);
  }
  bVar2 = *utf1;
  iVar4 = 1;
  if (((char)bVar2 < '\0') && (iVar4 = -1, (bVar2 & 0x40) != 0)) {
    uVar7 = 0x20;
    iVar5 = 2;
    do {
      iVar4 = iVar5;
      if ((uVar7 & bVar2) == 0) break;
      iVar5 = iVar5 + 1;
      uVar7 = uVar7 >> 1;
      iVar4 = -1;
    } while (iVar5 != 8);
  }
  if (utf1 != utf2 && iVar4 >= 1) {
    if (utf2 == (xmlChar *)0x0) {
      return 1;
    }
    lVar6 = 0;
    uVar7 = (uint)(iVar4 < 1);
    do {
      pbVar1 = utf2 + lVar6;
      bVar3 = false;
      uVar8 = (uint)utf1[lVar6] - (uint)*pbVar1;
      if (uVar8 == 0) {
        iVar4 = iVar4 + -1;
        if (iVar4 == 0) {
          iVar4 = 0;
        }
        else {
          bVar3 = true;
          uVar8 = uVar7;
        }
      }
      if (!bVar3) {
        return uVar8;
      }
      lVar6 = lVar6 + 1;
      uVar7 = uVar8;
    } while (*pbVar1 != 0);
  }
  return 0;
}

Assistant:

int
xmlUTF8Charcmp(const xmlChar *utf1, const xmlChar *utf2) {

    if (utf1 == NULL ) {
        if (utf2 == NULL)
            return 0;
        return -1;
    }
    return xmlStrncmp(utf1, utf2, xmlUTF8Size(utf1));
}